

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.hpp
# Opt level: O2

void __thiscall
LongReadsMapper::set_params
          (LongReadsMapper *this,uint8_t _k,int _max_index_freq,int _min_size,int _min_chain,
          int _max_jump,int _max_delta_change)

{
  this->k = _k;
  this->max_index_freq = _max_index_freq;
  this->min_size = _min_size;
  this->min_chain = _min_chain;
  this->max_jump = _max_jump;
  this->max_delta_change = _max_delta_change;
  return;
}

Assistant:

void set_params(uint8_t _k=15, int _max_index_freq=200, int _min_size=1000, int _min_chain=50, int _max_jump=500, int _max_delta_change = 60){
        k=_k;
        max_index_freq=_max_index_freq;
        min_size=_min_size;
        min_chain=_min_chain;
        max_jump=_max_jump;
        max_delta_change=_max_delta_change;
    }